

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

bool __thiscall
Clasp::mt::SharedLitsClause::minimize
          (SharedLitsClause *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  uint uVar1;
  SharedLiterals *pSVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  Solver::updateOnMinimize(s,&(this->super_ClauseHead).info_.super_ConstraintScore);
  pSVar2 = (this->super_ClauseHead).field_0.shared_;
  uVar5 = (ulong)(pSVar2->size_type_ & 0xfffffffc);
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 4) {
    uVar1 = *(uint *)((long)&pSVar2[1].refCount_.super___atomic_base<int>._M_i + uVar4);
    if (1 < (uVar1 ^ p.rep_)) {
      bVar3 = Solver::ccMinimize(s,(Literal)(uVar1 & 0xfffffffe ^ 2),rec);
      if (!bVar3) break;
    }
  }
  return uVar5 == uVar4;
}

Assistant:

bool SharedLitsClause::minimize(Solver& s, Literal p, CCMinRecursive* rec) {
	s.updateOnMinimize(info_.score());
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if (*r != p && !s.ccMinimize(~*r, rec)) { return false; }
	}
	return true;
}